

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  ssize_t extraout_RAX;
  buffer_appender<char> bVar2;
  basic_string_view<char> s;
  
  if (this->specs_ != (format_specs *)0x0) {
    pcVar1 = "false";
    if (SUB41(__fd,0) != false) {
      pcVar1 = "true";
    }
    s.size_ = (ulong)(uint)__fd & 0xff ^ 5;
    s.data_ = pcVar1;
    write<char>(this,s,this->specs_);
    return extraout_RAX;
  }
  bVar2 = write<char,fmt::v7::detail::buffer_appender<char>>
                    ((buffer_appender<char>)
                     (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                     container,SUB41(__fd,0));
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return (ssize_t)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

void write(bool value) {
    if (specs_)
      write(string_view(value ? "true" : "false"), *specs_);
    else
      out_ = detail::write<Char>(out_, value);
  }